

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void qDeleteAll<QList<MakefileGenerator::SubTarget*>::const_iterator>
               (const_iterator begin,const_iterator end)

{
  SubTarget *this;
  
  if (begin.i != end.i) {
    do {
      this = *begin.i;
      if (this != (SubTarget *)0x0) {
        MakefileGenerator::SubTarget::~SubTarget(this);
      }
      operator_delete(this,0xa8);
      begin.i = begin.i + 1;
    } while (begin.i != end.i);
  }
  return;
}

Assistant:

inline constexpr bool operator!=(const_iterator o) const { return i != o.i; }